

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  int iVar1;
  unsigned_long numFrames;
  PaError PVar2;
  void *__dest;
  long lVar3;
  char *format;
  unsigned_long framesGot;
  int xrun;
  unsigned_long framesAvail;
  unsigned_long local_58;
  PaError local_50;
  int local_4c;
  undefined8 local_48;
  void *local_40;
  ulong local_38;
  
  lVar3 = *(long *)((long)s + 0x2c0);
  local_48 = *(undefined8 *)((long)s + 0x340);
  if (lVar3 == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    PVar2 = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    PVar2 = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      PVar2 = -0x26fd;
    }
    __dest = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      __dest = *(void **)((long)s + 0x2e8);
      memcpy(__dest,buffer,(long)*(int *)((long)s + 0x290) << 3);
      lVar3 = *(long *)((long)s + 0x2c0);
    }
    local_40 = __dest;
    iVar1 = snd_pcm_state(lVar3);
    if ((iVar1 == 2) && (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar1 < 0)) {
      ReadStream_cold_1();
      PVar2 = -9999;
    }
    else if (frames != 0) {
      local_50 = PVar2;
      do {
        local_4c = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_38,&local_4c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
          ;
LAB_0010ede9:
          PaUtil_DebugPrint(format);
          PVar2 = paUtilErr_;
          break;
        }
        local_58 = local_38;
        if (frames <= local_38) {
          local_58 = frames;
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_58,&local_4c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
          ;
          goto LAB_0010ede9;
        }
        if (local_58 != 0) {
          numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_40,local_58)
          ;
          local_58 = numFrames;
          paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_4c);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
            ;
            goto LAB_0010ede9;
          }
          frames = frames - numFrames;
        }
        PVar2 = local_50;
      } while (frames != 0);
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_48;
  return PVar2;
}

Assistant:

static PaError ReadStream( PaStream* s, void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long framesGot, framesAvail;
    void *userBuffer;
    snd_pcm_t *save = stream->playback.pcm;

    assert( stream );

    PA_UNLESS( stream->capture.pcm, paCanNotReadFromAnOutputOnlyStream );

    /* Disregard playback */
    stream->playback.pcm = NULL;

    if( stream->overrun > 0. )
    {
        result = paInputOverflowed;
        stream->overrun = 0.0;
    }

    if( stream->capture.userInterleaved )
    {
        userBuffer = buffer;
    }
    else
    {
        /* Copy channels into local array */
        userBuffer = stream->capture.userBuffers;
        memcpy( userBuffer, buffer, sizeof (void *) * stream->capture.numUserChannels );
    }

    /* Start stream if in prepared state */
    if( alsa_snd_pcm_state( stream->capture.pcm ) == SND_PCM_STATE_PREPARED )
    {
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyInput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }
    }

end:
    stream->playback.pcm = save;
    return result;
error:
    goto end;
}